

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QMap<int,QVariant>>::emplace<QMap<int,QVariant>const&>
          (QMovableArrayOps<QMap<int,QVariant>> *this,qsizetype i,QMap<int,_QVariant> *args)

{
  totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
  *ptVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
  *pQVar5;
  long in_FS_OFFSET;
  QMap<int,_QVariant> tmp;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_00466bf3:
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )(args->d).d.ptr;
    if (local_30.d.ptr !=
        (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)0x0) {
      LOCK();
      (((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
         *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value =
           (Type)((int)(((QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)local_30.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + 1);
      UNLOCK();
    }
    lVar3 = *(long *)(this + 0x10);
    QArrayDataPointer<QMap<int,_QVariant>_>::detachAndGrow
              ((QArrayDataPointer<QMap<int,_QVariant>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
               (QMap<int,_QVariant> **)0x0,(QArrayDataPointer<QMap<int,_QVariant>_> *)0x0);
    lVar4 = *(long *)(this + 8);
    if (i == 0 && lVar3 != 0) {
      ((totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
        *)(lVar4 + -8))->ptr =
           (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)local_30.d.ptr;
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    else {
      ptVar1 = (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
                *)(lVar4 + i * 8);
      memmove(ptVar1 + 1,(void *)(lVar4 + i * 8),(*(long *)(this + 0x10) - i) * 8);
      ptVar1->ptr = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)local_30.d.ptr;
    }
    local_30.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_*>
          )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)0x0;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_30);
  }
  else {
    lVar3 = *(long *)(this + 0x10);
    if ((lVar3 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 3) + lVar3)) {
      pQVar5 = (args->d).d.ptr;
      *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        **)(*(long *)(this + 8) + lVar3 * 8) = pQVar5;
      if (pQVar5 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
    }
    else {
      if (((i != 0) || (piVar2 == (int *)0x0)) ||
         (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_00466bf3;
      pQVar5 = (args->d).d.ptr;
      *(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        **)(*(long *)(this + 8) + -8) = pQVar5;
      if (pQVar5 != (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                     *)0x0) {
        LOCK();
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value = (Type)((int)(pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.
                               super_QBasicAtomicInteger<int>._q_value + 1);
        UNLOCK();
      }
      *(long *)(this + 8) = *(long *)(this + 8) + -8;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }